

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::
     ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  undefined8 *puVar1;
  BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::GreaterThan> *this;
  idx_t iVar2;
  ArenaAllocator *pAVar3;
  ulong uVar4;
  STORAGE_TYPE *__s;
  InvalidInputException *pIVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  TYPE arg_val;
  TYPE val_val;
  UnifiedVectorFormat n_format;
  UnifiedVectorFormat arg_format;
  UnifiedVectorFormat val_format;
  UnifiedVectorFormat state_format;
  EXTRA_STATE val_extra_state;
  int local_1ec;
  anon_union_16_2_67f50693_for_value local_1e8;
  undefined1 local_1d8 [16];
  ulong local_1c8;
  long local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_178;
  long *local_170;
  long local_168;
  long local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  long *local_128;
  long local_120;
  long local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  long *local_e0;
  long local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Vector local_98 [8];
  LogicalType local_90 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_128);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_170);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_1b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_e0);
  MinMaxFallbackValue::CreateExtraState(local_98,(idx_t)inputs);
  MinMaxFallbackValue::PrepareData(inputs,count,local_98,(UnifiedVectorFormat *)&local_128);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0x68),(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)(inputs + 0xd0),(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  if (count != 0) {
    local_1c0 = local_d8;
    uVar6 = 0;
    local_1c8 = count;
    do {
      uVar8 = uVar6;
      if (*local_170 != 0) {
        uVar8 = (ulong)*(uint *)(*local_170 + uVar6 * 4);
      }
      uVar7 = uVar6;
      if (*local_128 != 0) {
        uVar7 = (ulong)*(uint *)(*local_128 + uVar6 * 4);
      }
      if (((local_160 == 0) ||
          ((*(ulong *)(local_160 + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0)) &&
         ((local_118 == 0 || ((*(ulong *)(local_118 + (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) != 0)
          ))) {
        uVar4 = uVar6;
        if (*local_e0 != 0) {
          uVar4 = (ulong)*(uint *)(*local_e0 + uVar6 * 4);
        }
        this = *(BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::GreaterThan> **)
                (local_1c0 + uVar4 * 8);
        if ((char)this[1].capacity == '\0') {
          uVar4 = uVar6;
          if (*local_1b8 != 0) {
            uVar4 = (ulong)*(uint *)(*local_1b8 + uVar6 * 4);
          }
          if (local_1a8 != 0) {
            if ((*(ulong *)(local_1a8 + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) == 0) {
              pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_1e8._0_8_ = local_1d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1e8,
                         "Invalid input for arg_min/arg_max: n value cannot be NULL","");
              duckdb::InvalidInputException::InvalidInputException
                        (pIVar5,(string *)&local_1e8.pointer);
              __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error
                         );
            }
          }
          iVar2 = *(idx_t *)(local_1b0 + uVar4 * 8);
          if ((long)iVar2 < 1) {
            pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_1e8._0_8_ = local_1d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e8,"Invalid input for arg_min/arg_max: n value must be > 0"
                       ,"");
            duckdb::InvalidInputException::InvalidInputException
                      (pIVar5,(string *)&local_1e8.pointer);
            __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
          }
          if (999999 < (long)iVar2) {
            pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_1e8._0_8_ = local_1d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1e8,
                       "Invalid input for arg_min/arg_max: n value must be < %d","");
            InvalidInputException::InvalidInputException<long>
                      (pIVar5,(string *)&local_1e8.pointer,1000000);
            __cxa_throw(pIVar5,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
          }
          pAVar3 = aggr_input->allocator;
          this->capacity = iVar2;
          __s = (STORAGE_TYPE *)duckdb::ArenaAllocator::AllocateAligned((ulong)pAVar3);
          memset(__s,0,this->capacity * 0x28);
          this->heap = __s;
          this->size = 0;
          *(undefined1 *)&this[1].capacity = 1;
          count = local_1c8;
        }
        local_1ec = *(int *)(local_168 + uVar8 * 4);
        puVar1 = (undefined8 *)(local_120 + uVar7 * 0x10);
        local_1e8._0_8_ = *puVar1;
        local_1e8.pointer.ptr = (char *)puVar1[1];
        BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::GreaterThan>::Insert
                  (this,aggr_input->allocator,&local_1ec,(string_t *)&local_1e8.pointer);
      }
      uVar6 = uVar6 + 1;
    } while (count != uVar6);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if (local_178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178);
  }
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
  }
  return;
}

Assistant:

static void ArgMinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {

	auto &val_vector = inputs[0];
	auto &arg_vector = inputs[1];
	auto &n_vector = inputs[2];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat arg_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);
	auto arg_extra_state = STATE::ARG_TYPE::CreateExtraState(arg_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);
	STATE::ARG_TYPE::PrepareData(arg_vector, count, arg_extra_state, arg_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto arg_idx = arg_format.sel->get_index(i);
		const auto val_idx = val_format.sel->get_index(i);
		if (!arg_format.validity.RowIsValid(arg_idx) || !val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto arg_val = STATE::ARG_TYPE::Create(arg_format, arg_idx);
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);

		state.heap.Insert(aggr_input.allocator, arg_val, val_val);
	}
}